

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::BaseBuilder::labelNodeOf(BaseBuilder *this,LabelNode **out,uint32_t labelId)

{
  ZoneVector<asmjit::v1_14::LabelNode_*> *this_00;
  CodeHolder *pCVar1;
  Error EVar2;
  uint uVar3;
  undefined4 uVar4;
  ulong unaff_RBP;
  BaseBuilder *self;
  BaseBuilder *this_01;
  LabelNode *unaff_R13;
  LabelEntry *pLStack_58;
  LabelNode **ppLStack_50;
  ulong uStack_48;
  ulong uStack_40;
  size_t sStack_38;
  
  *out = (LabelNode *)0x0;
  pCVar1 = (this->super_BaseEmitter)._code;
  if (pCVar1 == (CodeHolder *)0x0) {
    return 5;
  }
  if (*(uint *)&pCVar1->field_0x100 <= labelId) {
    return 0xc;
  }
  this_00 = &this->_labelNodes;
  uVar3 = *(uint *)&this->field_0x190;
  if (uVar3 <= labelId) {
    uStack_40 = 0x116d14;
    EVar2 = ZoneVectorBase::_resize((ZoneVectorBase *)this_00,&this->_allocator,8,labelId + 1);
    if (EVar2 != 0) {
      return EVar2;
    }
    uVar3 = *(uint *)&this->field_0x190;
  }
  if (labelId < uVar3) {
    unaff_RBP = (ulong)labelId;
    unaff_R13 = *(LabelNode **)(*(long *)&this_00->field_0x0 + unaff_RBP * 8);
    if (unaff_R13 != (LabelNode *)0x0) goto LAB_00116d9b;
    if (*(long *)&this->_allocator == 0) goto LAB_00116dc2;
    this_01 = (BaseBuilder *)&this->_allocator;
    self = (BaseBuilder *)0x38;
    uStack_40 = 0x116d5a;
    unaff_R13 = (LabelNode *)ZoneAllocator::_alloc((ZoneAllocator *)this_01,0x38,&sStack_38);
    if (unaff_R13 == (LabelNode *)0x0) goto LAB_00116dc7;
    *(undefined8 *)unaff_R13 = 0;
    *(undefined8 *)(unaff_R13 + 8) = 0;
    unaff_R13[0x10] = (LabelNode)0x3;
    unaff_R13[0x11] = (LabelNode)(this->_nodeFlags | (kActsAsLabel|kHasNoEffect));
    *(undefined8 *)(unaff_R13 + 0x12) = 0;
    *(undefined8 *)(unaff_R13 + 0x1a) = 0;
    *(undefined8 *)(unaff_R13 + 0x20) = 0;
    *(undefined8 *)(unaff_R13 + 0x28) = 0;
    *(uint32_t *)(unaff_R13 + 0x30) = labelId;
  }
  else {
    uStack_40 = 0x116dc2;
    labelNodeOf();
LAB_00116dc2:
    uStack_40 = 0x116dc7;
    labelNodeOf();
LAB_00116dc7:
    self = (BaseBuilder *)0x1;
    uStack_40 = 0x116dd6;
    this_01 = this;
    EVar2 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
    if (EVar2 != 0) {
      return EVar2;
    }
  }
  if (*(uint *)&this->field_0x190 <= labelId) {
    uStack_40 = 0x116de1;
    labelNodeOf();
    pCVar1 = (self->super_BaseEmitter)._code;
    uVar4 = 0xffffffff;
    if (((pCVar1 != (CodeHolder *)0x0) &&
        (ppLStack_50 = out, uStack_48 = (ulong)labelId, uStack_40 = unaff_RBP,
        EVar2 = CodeHolder::newLabelEntry(pCVar1,&pLStack_58), EVar2 == 0)) &&
       (EVar2 = BaseBuilder_newLabelInternal(self,*(uint32_t *)&pLStack_58->field_0xc), EVar2 == 0))
    {
      uVar4 = *(undefined4 *)&pLStack_58->field_0xc;
    }
    *(undefined4 *)&(this_01->super_BaseEmitter)._vptr_BaseEmitter = 5;
    *(undefined4 *)((long)&(this_01->super_BaseEmitter)._vptr_BaseEmitter + 4) = uVar4;
    (this_01->super_BaseEmitter)._emitterType = kNone;
    (this_01->super_BaseEmitter)._emitterFlags = kNone;
    (this_01->super_BaseEmitter)._instructionAlignment = '\0';
    (this_01->super_BaseEmitter)._reservedBaseEmitter = '\0';
    (this_01->super_BaseEmitter)._validationFlags = kNone;
    return (Error)this_01;
  }
  *(LabelNode **)(*(long *)&this_00->field_0x0 + unaff_RBP * 8) = unaff_R13;
LAB_00116d9b:
  *out = unaff_R13;
  return 0;
}

Assistant:

Error BaseBuilder::labelNodeOf(LabelNode** out, uint32_t labelId) {
  *out = nullptr;

  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  uint32_t index = labelId;
  if (ASMJIT_UNLIKELY(index >= _code->labelCount()))
    return DebugUtils::errored(kErrorInvalidLabel);

  if (index >= _labelNodes.size())
    ASMJIT_PROPAGATE(_labelNodes.resize(&_allocator, index + 1));

  LabelNode* node = _labelNodes[index];
  if (!node) {
    ASMJIT_PROPAGATE(_newNodeT<LabelNode>(&node, labelId));
    _labelNodes[index] = node;
  }

  *out = node;
  return kErrorOk;
}